

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::InitValueVisitor::visit(InitValueVisitor *this,Generator *gen)

{
  StatementType SVar1;
  VarType VVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *this_00;
  element_type *this_01;
  Var **ppVVar4;
  element_type *__args;
  undefined1 local_48 [8];
  shared_ptr<kratos::AssignStmt> assign;
  shared_ptr<kratos::Stmt> stmt;
  uint64_t i;
  uint64_t stmt_count;
  Generator *gen_local;
  InitValueVisitor *this_local;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Generator::stmts_count(gen);
  for (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < p_Var3;
      stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    Generator::get_stmt((Generator *)
                        &assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(uint32_t)gen);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&assign.
                             super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    SVar1 = Stmt::type(this_00);
    if (SVar1 == Assign) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Stmt::as<kratos::AssignStmt>((Stmt *)local_48);
      this_01 = std::
                __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
      ppVVar4 = AssignStmt::right(this_01);
      VVar2 = Var::type(*ppVVar4);
      if (VVar2 == ConstValue) {
        __args = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_48
                           );
        std::function<void_(kratos::AssignStmt_*)>::operator()(&this->fn_,__args);
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_48);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &assign.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void visit(Generator *gen) override {
        uint64_t stmt_count = gen->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Assign) {
                auto assign = stmt->as<AssignStmt>();
                if (assign->right()->type() == VarType::ConstValue) {
                    fn_(assign.get());
                }
            }
        }
    }